

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasMapFields(FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor;
  int local_1c;
  int i;
  FileDescriptor *file_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = FileDescriptor::message_type_count(file);
    if (iVar2 <= local_1c) {
      return false;
    }
    descriptor = FileDescriptor::message_type(file,local_1c);
    bVar1 = HasMapFields(descriptor);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool HasMapFields(const FileDescriptor* file) {
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasMapFields(file->message_type(i))) return true;
  }
  return false;
}